

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase445::run(TestCase445 *this)

{
  long *plVar1;
  uint *puVar2;
  char *pcVar3;
  undefined8 *puVar4;
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t> *ptrCopy;
  uint destroyed3;
  DebugComparison<unsigned_int_&,_int> _kjCondition;
  uint destroyed2;
  uint destroyed1;
  uint counter;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> combined;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_> arr;
  uint local_e4;
  DebugComparison<unsigned_int_&,_int> local_e0;
  uint local_b4;
  long *local_b0;
  uint local_a8 [2];
  long *local_a0;
  uint *local_98;
  undefined8 uStack_90;
  undefined8 *local_88;
  uint *local_78;
  undefined8 uStack_70;
  undefined8 *local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 *local_40;
  
  local_a8[1] = 0;
  local_a8[0] = 0;
  local_b4 = 0;
  local_e4 = 0;
  local_b0 = (long *)operator_new(0x10);
  *local_b0 = (long)(local_a8 + 1);
  local_b0[1] = (long)local_a8;
  plVar1 = (long *)operator_new(0x10);
  *plVar1 = (long)(local_a8 + 1);
  plVar1[1] = (long)&local_b4;
  local_a0 = (long *)operator_new(0x10);
  *local_a0 = (long)(local_a8 + 1);
  local_a0[1] = (long)&local_e4;
  puVar2 = (uint *)_::HeapArrayDisposer::allocateImpl
                             (0x10,0,1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  local_40 = &_::HeapArrayDisposer::instance;
  *(undefined8 **)puVar2 =
       &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  *(long **)(puVar2 + 2) = local_b0;
  uStack_70 = 1;
  local_68 = &_::HeapArrayDisposer::instance;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  local_78 = puVar2;
  pcVar3 = (char *)operator_new(0x30);
  *(undefined8 **)(pcVar3 + 8) =
       &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  *(long **)(pcVar3 + 0x10) = plVar1;
  *(uint **)(pcVar3 + 0x18) = puVar2;
  pcVar3[0x20] = '\x01';
  pcVar3[0x21] = '\0';
  pcVar3[0x22] = '\0';
  pcVar3[0x23] = '\0';
  pcVar3[0x24] = '\0';
  pcVar3[0x25] = '\0';
  pcVar3[0x26] = '\0';
  pcVar3[0x27] = '\0';
  *(undefined8 **)(pcVar3 + 0x28) = &_::HeapArrayDisposer::instance;
  local_78 = (uint *)0x0;
  uStack_70 = 0;
  *(undefined ***)pcVar3 = &PTR_disposeImpl_00223ca0;
  local_e0._8_8_ = 1;
  local_e0.left = puVar2;
  local_e0.op.content.ptr = pcVar3;
  puVar4 = (undefined8 *)operator_new(0x30);
  puVar4[1] = &_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  puVar4[2] = local_a0;
  puVar4[3] = puVar2;
  puVar4[4] = 1;
  puVar4[5] = pcVar3;
  *puVar4 = &PTR_disposeImpl_00223ca0;
  uStack_90 = 1;
  local_e0.result = local_a8[0] == 0;
  local_e0._8_8_ = local_e0._8_8_ & 0xffffffff00000000;
  local_e0.op.content.ptr = " == ";
  local_e0.op.content.size_ = 5;
  local_98 = puVar2;
  local_88 = puVar4;
  if (!local_e0.result && _::Debug::minSeverity < 3) {
    local_e0.left = local_a8;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d4,ERROR,"\"failed: expected \" \"destroyed1 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed1 == 0",&local_e0);
  }
  local_e0.result = local_b4 == 0;
  local_e0._8_8_ = local_e0._8_8_ & 0xffffffff00000000;
  local_e0.op.content.ptr = " == ";
  local_e0.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !local_e0.result) {
    local_e0.left = &local_b4;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d5,ERROR,"\"failed: expected \" \"destroyed2 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed2 == 0",&local_e0);
  }
  local_e0.result = local_e4 == 0;
  local_e0.left = &local_e4;
  local_e0._8_8_ = local_e0._8_8_ & 0xffffffff00000000;
  local_e0.op.content.ptr = " == ";
  local_e0.op.content.size_ = 5;
  if ((!local_e0.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1d6,ERROR,"\"failed: expected \" \"destroyed3 == 0\", _kjCondition",
               (char (*) [33])"failed: expected destroyed3 == 0",&local_e0);
  }
  local_98 = (uint *)0x0;
  uStack_90 = 0;
  (**(code **)*puVar4)
            (puVar4,puVar2,0x10,1,1,
             ArrayDisposer::
             Dispose_<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder,_std::nullptr_t>_>
             ::destruct);
  local_e0.result = local_a8[0] == 1;
  local_e0.right = 1;
  local_e0.op.content.ptr = " == ";
  local_e0.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !local_e0.result) {
    local_e0.left = local_a8;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1da,ERROR,"\"failed: expected \" \"destroyed1 == 1\", _kjCondition, destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",&local_e0,local_a8);
  }
  local_e0.result = local_b4 == 2;
  local_e0.right = 2;
  local_e0.op.content.ptr = " == ";
  local_e0.op.content.size_ = 5;
  if (_::Debug::minSeverity < 3 && !local_e0.result) {
    local_e0.left = &local_b4;
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1db,ERROR,"\"failed: expected \" \"destroyed2 == 2\", _kjCondition, destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",&local_e0,&local_b4);
  }
  local_e0.result = local_e4 == 3;
  local_e0.left = &local_e4;
  local_e0.right = 3;
  local_e0.op.content.ptr = " == ";
  local_e0.op.content.size_ = 5;
  if ((!local_e0.result) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],kj::_::DebugComparison<unsigned_int&,int>&,unsigned_int&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1dc,ERROR,"\"failed: expected \" \"destroyed3 == 3\", _kjCondition, destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",&local_e0,&local_e4);
  }
  return;
}

Assistant:

TEST(Array, AttachNested) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2)).attach(kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);
  KJ_EXPECT(combined.size() == 1);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}